

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_rawset(jit_State *J,RecordFFData *rd)

{
  uint *puVar1;
  TValue *pTVar2;
  TValue local_48;
  TValue local_40;
  TValue TStack_38;
  uint local_18;
  uint local_14;
  uint local_10;
  undefined4 local_4;
  
  puVar1 = J->base;
  local_18 = *puVar1;
  local_14 = puVar1[1];
  local_10 = puVar1[2];
  if ((local_10 != 0 && local_14 != 0) && (local_18 & 0x1f000000) == 0xb000000) {
    local_4 = 0;
    pTVar2 = rd->argv;
    local_48.field_2.field_0 = (pTVar2->field_2).field_0;
    local_48.field_2.it = 0xfffffff4;
    local_40 = pTVar2[1];
    TStack_38 = pTVar2[2];
    lj_record_idx(J,(RecordIndex *)&local_48.field_2);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawset(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1]; ix.val = J->base[2];
  if (tref_istab(ix.tab) && ix.key && ix.val) {
    ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    copyTV(J->L, &ix.valv, &rd->argv[2]);
    lj_record_idx(J, &ix);
    /* Pass through table at J->base[0] as result. */
  }  /* else: Interpreter will throw. */
}